

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O2

void av1_highbd_upsample_intra_edge_c(uint16_t *p,int sz,int bd)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint16_t in [19];
  ushort local_56 [2];
  uint16_t local_52 [17];
  
  local_56[0] = p[-1];
  uVar4 = 0;
  uVar6 = 0;
  if (0 < sz) {
    uVar6 = (ulong)(uint)sz;
  }
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    local_52[uVar4 - 1] = p[uVar4];
  }
  local_52[(long)sz + -1] = p[(long)sz + -1];
  p[-2] = local_56[0];
  uVar5 = (uint)local_56[0];
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = local_56[uVar4];
    uVar2 = local_52[uVar4 - 1];
    uVar3 = clip_pixel_highbd((int)((((uint)uVar2 + (uint)uVar1) * 9 - (local_52[uVar4] + uVar5)) +
                                   8) >> 4,bd);
    p[uVar4 * 2 + -1] = uVar3;
    p[uVar4 * 2] = uVar2;
    uVar5 = (uint)uVar1;
  }
  return;
}

Assistant:

void av1_highbd_upsample_intra_edge_c(uint16_t *p, int sz, int bd) {
  // interpolate half-sample positions
  assert(sz <= MAX_UPSAMPLE_SZ);

  uint16_t in[MAX_UPSAMPLE_SZ + 3];
  // copy p[-1..(sz-1)] and extend first and last samples
  in[0] = p[-1];
  in[1] = p[-1];
  for (int i = 0; i < sz; i++) {
    in[i + 2] = p[i];
  }
  in[sz + 2] = p[sz - 1];

  // interpolate half-sample edge positions
  p[-2] = in[0];
  for (int i = 0; i < sz; i++) {
    int s = -in[i] + (9 * in[i + 1]) + (9 * in[i + 2]) - in[i + 3];
    s = (s + 8) >> 4;
    s = clip_pixel_highbd(s, bd);
    p[2 * i - 1] = s;
    p[2 * i] = in[i + 2];
  }
}